

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall httplib::Server::process_and_close_socket(Server *this,socket_t sock)

{
  time_t keep_alive_timeout_sec;
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  bool local_8d;
  socket_t local_8c;
  anon_class_48_6_b559e8da local_88;
  time_t local_58;
  time_t local_50;
  time_t local_48;
  time_t local_40;
  anon_class_8_1_8991fb9c local_38;
  
  sVar3 = this->keep_alive_max_count_;
  keep_alive_timeout_sec = this->keep_alive_timeout_sec_;
  local_40 = this->read_timeout_sec_;
  local_48 = this->read_timeout_usec_;
  local_50 = this->write_timeout_sec_;
  local_58 = this->write_timeout_usec_;
  local_88.callback = &local_38;
  local_88.sock = &local_8c;
  local_88.read_timeout_sec = &local_40;
  local_88.read_timeout_usec = &local_48;
  local_88.write_timeout_sec = &local_50;
  local_88.write_timeout_usec = &local_58;
  bVar1 = false;
  local_8c = sock;
  local_38.this = this;
  if ((sVar3 != 0) && (bVar1 = false, (this->svr_sock_).super___atomic_base<int>._M_i != -1)) {
    bVar1 = detail::keep_alive(sock,keep_alive_timeout_sec);
    if (bVar1) {
      while( true ) {
        local_8d = false;
        bVar1 = detail::anon_func::anon_class_48_6_b559e8da::operator()
                          (&local_88,sVar3 == 1,&local_8d);
        if ((!bVar1) || ((local_8d & 1U) != 0)) break;
        sVar3 = sVar3 - bVar1;
        if ((sVar3 == 0) ||
           (((this->svr_sock_).super___atomic_base<int>._M_i == -1 ||
            (bVar2 = detail::keep_alive(sock,keep_alive_timeout_sec), !bVar2)))) break;
      }
    }
    else {
      bVar1 = false;
    }
  }
  shutdown(sock,2);
  close(sock);
  return bVar1;
}

Assistant:

inline bool Server::process_and_close_socket(socket_t sock) {
  auto ret = detail::process_server_socket(
      svr_sock_, sock, keep_alive_max_count_, keep_alive_timeout_sec_,
      read_timeout_sec_, read_timeout_usec_, write_timeout_sec_,
      write_timeout_usec_,
      [this](Stream &strm, bool close_connection, bool &connection_closed) {
        return process_request(strm, close_connection, connection_closed,
                               nullptr);
      });

  detail::shutdown_socket(sock);
  detail::close_socket(sock);
  return ret;
}